

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O1

void __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::buffered_reader(buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                  *this,function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                        *refill,size_t buffer_size)

{
  pointer puVar1;
  allocator_type local_29;
  extent_type<_1L> local_28 [2];
  
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::function(&this->refill_,refill);
  local_28[0].size_._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->buf_,buffer_size + (buffer_size == 0),(value_type_conflict1 *)local_28,&local_29
            );
  puVar1 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pstore::gsl::details::extent_type<-1L>::extent_type
            (local_28,(long)(this->buf_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  (this->span_).storage_.super_extent_type<_1L>.size_ =
       CONCAT71(local_28[0].size_._1_7_,(undefined1)local_28[0].size_);
  (this->span_).storage_.data_ = puVar1;
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&this->pos_,&this->span_,0);
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&this->end_,&this->span_,0);
  this->is_eof_ = false;
  (this->push_).valid_ = false;
  check_invariants(this);
  return;
}

Assistant:

buffered_reader<IO, RefillFunction>::buffered_reader (RefillFunction const refill,
                                                              std::size_t const buffer_size)
                : refill_{refill}
                , buf_ (std::max (buffer_size, std::size_t{1}), std::uint8_t{0})
                , span_{gsl::make_span (buf_)}
                , pos_{span_.begin ()}
                , end_{span_.begin ()} {
            this->check_invariants ();
        }